

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
::TestBody(optTyped_otherTypeCopyAssignmentEmptyForEmpty_Test<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
           *this)

{
  value_type *lhs;
  bool bVar1;
  opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>_> oVar2;
  storage_type sVar3;
  char *pcVar4;
  char *in_R9;
  internal iVar5;
  opt_type o2;
  other_opt_type o1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  storage_type local_59;
  AssertHelper local_58;
  opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>_> local_49;
  AssertHelper local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  string local_30;
  
  local_49.storage_ = -1;
  local_59.null_value = '\a';
  mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>::
  operator=<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)__xff_>,_true>
            ((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
              *)&local_59.value,&local_49);
  iVar5 = (internal)(local_49.storage_ == -1);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48.data_._0_1_ = (storage_type)iVar5;
  if (!(bool)iVar5) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_48,(AssertionResult *)0x1c035d,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x28d,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
      local_58.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_1_ = (storage_type)(local_49.storage_ == -1);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_49.storage_ != -1) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_48,(AssertionResult *)"o1.has_value()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x28e,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
      local_58.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<signed_char,_mp::opt_null_value_policy<signed_char,_(signed_char)'\xff'>_>::value
              (&local_49);
  }
  testing::Message::Message((Message *)&local_30);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x28f,
             "Expected: o1.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)local_30._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
    local_30._M_dataplus._M_p = (pointer)0x0;
  }
  lhs = &(this->
         super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
         ).value_2;
  oVar2.storage_ =
       (this->
       super_optTyped<mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>_>
       ).other_value_2;
  if (local_49.storage_ != -1) {
    oVar2.storage_ = local_49.storage_;
  }
  local_48.data_._0_1_ = (storage_type)oVar2.storage_;
  testing::internal::EqHelper<false>::Compare<(anonymous_namespace)::weekday,signed_char>
            ((EqHelper<false> *)&local_30,"this->value_2","o1.value_or(this->other_value_2)",lhs,
             (char *)&local_48);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x290,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_48.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_48.data_ + 8))();
      }
      local_48.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar5 = (internal)(local_59.null_value == '\a');
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48.data_._0_1_ = (storage_type)iVar5;
  if (!(bool)iVar5) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_48,(AssertionResult *)0x1bffd7,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x291,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
      local_58.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_1_ = (storage_type)(local_59.null_value == '\a');
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_59.null_value != '\a') {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_48,(AssertionResult *)"o2.has_value()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x292,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_58.data_ + 8))();
      }
      local_58.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    mp::opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
    ::value((opt<(anonymous_namespace)::weekday,_mp::opt_default_policy<(anonymous_namespace)::weekday>_>
             *)&local_59.value);
  }
  testing::Message::Message((Message *)&local_30);
  testing::internal::AssertHelper::AssertHelper
            (&local_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x293,
             "Expected: o2.value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_30);
  testing::internal::AssertHelper::~AssertHelper(&local_48);
  if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)local_30._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
    local_30._M_dataplus._M_p = (pointer)0x0;
  }
  sVar3.null_value = lhs->value_;
  if (local_59.null_value != '\a') {
    sVar3 = local_59;
  }
  local_48.data_._0_1_ = sVar3.null_value;
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::weekday,(anonymous_namespace)::weekday>
            ((EqHelper<false> *)&local_30,"this->value_2","o2.value_or(this->value_2)",lhs,
             (weekday *)&local_48);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x294,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_48.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_48.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_48.data_ + 8))();
      }
      local_48.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeCopyAssignmentEmptyForEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1;
  opt_type o2;
  o2 = o1;
  EXPECT_FALSE(o1);
  EXPECT_FALSE(o1.has_value());
  EXPECT_THROW(o1.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o1.value_or(this->other_value_2));
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}